

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::
CmpHelperEQFailure<std::vector<CLI::App*,std::allocator<CLI::App*>>,std::vector<CLI::App*,std::allocator<CLI::App*>>>
          (internal *this,char *lhs_expression,char *rhs_expression,
          vector<CLI::App_*,_std::allocator<CLI::App_*>_> *lhs,
          vector<CLI::App_*,_std::allocator<CLI::App_*>_> *rhs)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult AVar1;
  string local_70;
  string local_50;
  internal *local_30;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *rhs_local;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *lhs_local;
  char *rhs_expression_local;
  char *lhs_expression_local;
  
  local_30 = (internal *)rhs;
  rhs_local = lhs;
  lhs_local = (vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)rhs_expression;
  rhs_expression_local = lhs_expression;
  lhs_expression_local = (char *)this;
  FormatForComparisonFailureMessage<std::vector<CLI::App*,std::allocator<CLI::App*>>,std::vector<CLI::App*,std::allocator<CLI::App*>>>
            (&local_50,(internal *)lhs,rhs,lhs);
  FormatForComparisonFailureMessage<std::vector<CLI::App*,std::allocator<CLI::App*>>,std::vector<CLI::App*,std::allocator<CLI::App*>>>
            (&local_70,local_30,rhs_local,lhs);
  EqFailure(this,lhs_expression,rhs_expression,(string *)&local_50,(string *)&local_70,false);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  AVar1.message_.ptr_ = extraout_RDX.ptr_;
  AVar1._0_8_ = this;
  return AVar1;
}

Assistant:

AssertionResult CmpHelperEQFailure(const char* lhs_expression,
                                   const char* rhs_expression,
                                   const T1& lhs, const T2& rhs) {
  return EqFailure(lhs_expression,
                   rhs_expression,
                   FormatForComparisonFailureMessage(lhs, rhs),
                   FormatForComparisonFailureMessage(rhs, lhs),
                   false);
}